

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioaWriteAig.c
# Opt level: O3

Vec_Int_t * Ioa_WriteAigerLiterals(Aig_Man_t *pMan)

{
  ulong uVar1;
  Vec_Int_t *p;
  int *piVar2;
  Vec_Ptr_t *pVVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  
  iVar6 = pMan->nObjs[3];
  p = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar6 - 1U) {
    iVar4 = iVar6;
  }
  p->nSize = 0;
  p->nCap = iVar4;
  if (iVar4 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar4 << 2);
  }
  p->pArray = piVar2;
  iVar4 = pMan->nRegs;
  uVar5 = iVar6 - iVar4;
  pVVar3 = pMan->vCos;
  if ((int)uVar5 < pVVar3->nSize) {
    uVar7 = (ulong)uVar5;
    do {
      if ((int)uVar5 < 0) goto LAB_00790b33;
      uVar1 = *(ulong *)((long)pVVar3->pArray[uVar7] + 8);
      iVar6 = *(int *)((uVar1 & 0xfffffffffffffffe) + 0x28);
      Vec_IntPush(p,((uint)(iVar6 == 0) ^ (uint)uVar1 & 1) + iVar6 * 2);
      uVar7 = uVar7 + 1;
      pVVar3 = pMan->vCos;
    } while ((int)uVar7 < pVVar3->nSize);
    iVar4 = pMan->nRegs;
    iVar6 = pMan->nObjs[3];
  }
  if (iVar4 < iVar6) {
    lVar8 = 0;
    do {
      if (pMan->vCos->nSize <= lVar8) {
LAB_00790b33:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar7 = *(ulong *)((long)pMan->vCos->pArray[lVar8] + 8);
      iVar6 = *(int *)((uVar7 & 0xfffffffffffffffe) + 0x28);
      Vec_IntPush(p,((uint)(iVar6 == 0) ^ (uint)uVar7 & 1) + iVar6 * 2);
      lVar8 = lVar8 + 1;
    } while (lVar8 < (long)pMan->nObjs[3] - (long)pMan->nRegs);
  }
  return p;
}

Assistant:

Vec_Int_t * Ioa_WriteAigerLiterals( Aig_Man_t * pMan )
{
    Vec_Int_t * vLits;
    Aig_Obj_t * pObj, * pDriver;
    int i;
    vLits = Vec_IntAlloc( Aig_ManCoNum(pMan) );
    Aig_ManForEachLiSeq( pMan, pObj, i )
    {
        pDriver = Aig_ObjFanin0(pObj);
        Vec_IntPush( vLits, Ioa_ObjMakeLit( Ioa_ObjAigerNum(pDriver), Aig_ObjFaninC0(pObj) ^ (Ioa_ObjAigerNum(pDriver) == 0) ) );
    }
    Aig_ManForEachPoSeq( pMan, pObj, i )
    {
        pDriver = Aig_ObjFanin0(pObj);
        Vec_IntPush( vLits, Ioa_ObjMakeLit( Ioa_ObjAigerNum(pDriver), Aig_ObjFaninC0(pObj) ^ (Ioa_ObjAigerNum(pDriver) == 0) ) );
    }
    return vLits;
}